

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileMutator.cpp
# Opt level: O1

void DynamicProfileMutator::Mutate(FunctionBody *functionBody)

{
  Type *addr;
  DynamicProfileMutator *pDVar1;
  ScriptContext *scriptContext;
  DynamicProfileInfo *pDVar2;
  
  scriptContext = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  pDVar1 = scriptContext->threadContext->dynamicProfileMutator;
  if (pDVar1 != (DynamicProfileMutator *)0x0) {
    addr = &functionBody->dynamicProfileInfo;
    if ((functionBody->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
      pDVar2 = Js::DynamicProfileInfo::New(scriptContext->recycler,functionBody,false);
      Memory::Recycler::WBSetBit((char *)addr);
      (functionBody->dynamicProfileInfo).ptr = pDVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    }
    (*(code *)**(undefined8 **)pDVar1)(pDVar1,addr->ptr);
    Js::DynamicProfileInfo::Save(scriptContext);
    return;
  }
  return;
}

Assistant:

void
DynamicProfileMutator::Mutate(Js::FunctionBody * functionBody)
{
    Js::ScriptContext * scriptContext = functionBody->GetScriptContext();
    DynamicProfileMutator * dynamicProfileMutator = scriptContext->GetThreadContext()->dynamicProfileMutator;
    if (dynamicProfileMutator != nullptr)
    {
        if (functionBody->dynamicProfileInfo == nullptr)
        {
            functionBody->dynamicProfileInfo = Js::DynamicProfileInfo::New(scriptContext->GetRecycler(), functionBody);
        }

        dynamicProfileMutator->Mutate(functionBody->dynamicProfileInfo);
        // Save the profile information, it will help in case of Crash/Failure
        Js::DynamicProfileInfo::Save(scriptContext);
    }
}